

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *this;
  difference_type dVar3;
  T tmp;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  sift_1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  sift;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  cur;
  size_t limit;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  reference in_stack_ffffffffffffffa0;
  reference in_stack_ffffffffffffffa8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_50;
  pair<int,_int> local_48;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_40;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_30;
  ulong local_28;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)in_stack_ffffffffffffffa0,
                     (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if (!bVar1) {
    local_28 = 0;
    local_30 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)in_stack_ffffffffffffffa8,(difference_type)in_stack_ffffffffffffffa0);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
          bVar1) {
      local_38._M_current = local_30._M_current;
      local_40 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)in_stack_ffffffffffffffa8,(difference_type)in_stack_ffffffffffffffa0
                            );
      in_stack_ffffffffffffffa8 =
           __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(&local_38);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator*(&local_40);
      bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)cur._M_current,sift._M_current,sift_1._M_current
                        );
      if (bVar1) {
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_38);
        local_48 = *ppVar2;
        do {
          in_stack_ffffffffffffffa0 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_40);
          local_50 = __gnu_cxx::
                     __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     ::operator--((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                   *)in_stack_ffffffffffffffa8,
                                  (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          ppVar2 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator*(&local_50);
          std::pair<int,_int>::operator=(ppVar2,in_stack_ffffffffffffffa0);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)in_stack_ffffffffffffffa0,
                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          in_stack_ffffffffffffff9f = false;
          if (bVar1) {
            this = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
            __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator*(this);
            in_stack_ffffffffffffff9f =
                 presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)cur._M_current,sift._M_current,
                            sift_1._M_current);
          }
        } while ((bool)in_stack_ffffffffffffff9f != false);
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_38);
        std::pair<int,_int>::operator=(ppVar2,&local_48);
        dVar3 = __gnu_cxx::operator-
                          ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)in_stack_ffffffffffffffa0,
                           (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        local_28 = dVar3 + local_28;
      }
      if (8 < local_28) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_30);
    }
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }